

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModel.cpp
# Opt level: O3

vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
* __thiscall
psy::C::SemanticModel::
fieldsFor_CORE<std::vector<psy::C::FieldDeclarationSymbol_const*,std::allocator<psy::C::FieldDeclarationSymbol_const*>>>
          (vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
           *__return_storage_ptr__,SemanticModel *this,FieldDeclarationSyntax *node,
          vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
          *decls)

{
  pointer ppFVar1;
  SymbolKind SVar2;
  int iVar3;
  iterator iVar4;
  Symbol *pSVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar6;
  DeclaratorListSyntax *pDVar7;
  FieldDeclarationSyntax *local_40;
  vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  *local_38;
  
  local_40 = node;
  local_38 = __return_storage_ptr__;
  iVar4 = std::
          _Hashtable<const_psy::C::SyntaxNode_*,_std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>,_std::allocator<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>_>,_std::__detail::_Select1st,_std::equal_to<const_psy::C::SyntaxNode_*>,_std::hash<const_psy::C::SyntaxNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(((this->impl_)._M_t.
                    super___uniq_ptr_impl<psy::C::SemanticModel::SemanticModelImpl,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
                    .super__Head_base<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_false>.
                   _M_head_impl)->declsBySyntax_)._M_h,(key_type *)&local_40);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>,_false>
      ._M_cur == (__node_type *)0x0) {
    pDVar7 = node->decltors_;
    if (pDVar7 != (DeclaratorListSyntax *)0x0) {
      do {
        pSVar5 = &declarationBy(this,(pDVar7->
                                     super_CoreSyntaxNodeList<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                                     ).
                                     super_List<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                                     .value)->super_Symbol;
        if (pSVar5 == (Symbol *)0x0) {
          if (((this->impl_)._M_t.
               super___uniq_ptr_impl<psy::C::SemanticModel::SemanticModelImpl,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
               ._M_t.
               super__Tuple_impl<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
               .super__Head_base<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_false>.
              _M_head_impl)->bindingIsOK_ == true) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"[ASSERT] at ",0xc);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/SemanticModel.cpp"
                       ,0x5c);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x106);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<empty message>",0xf);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
          }
        }
        else {
          SVar2 = Symbol::kind(pSVar5);
          if (SVar2 != FieldDeclaration) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"[ASSERT] at ",0xc);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/SemanticModel.cpp"
                       ,0x5c);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x109);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<empty message>",0xf);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
          }
          iVar3 = (*pSVar5->_vptr_Symbol[0x14])(pSVar5);
          local_40 = (FieldDeclarationSyntax *)CONCAT44(extraout_var_00,iVar3);
          std::
          vector<psy::C::FieldDeclarationSymbol_const*,std::allocator<psy::C::FieldDeclarationSymbol_const*>>
          ::emplace_back<psy::C::FieldDeclarationSymbol_const*>
                    ((vector<psy::C::FieldDeclarationSymbol_const*,std::allocator<psy::C::FieldDeclarationSymbol_const*>>
                      *)decls,(FieldDeclarationSymbol **)&local_40);
        }
        pDVar7 = (pDVar7->
                 super_CoreSyntaxNodeList<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                 ).
                 super_List<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                 .next;
      } while (pDVar7 != (SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*> *)0x0);
    }
  }
  else {
    pSVar5 = (Symbol *)
             (**(code **)(**(long **)((long)iVar4.
                                            super__Node_iterator_base<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>,_false>
                                            ._M_cur + 0x10) + 0x30))();
    SVar2 = Symbol::kind(pSVar5);
    if (SVar2 == FieldDeclaration) {
      iVar3 = (*pSVar5->_vptr_Symbol[0x14])(pSVar5);
      local_40 = (FieldDeclarationSyntax *)CONCAT44(extraout_var,iVar3);
      std::
      vector<psy::C::FieldDeclarationSymbol_const*,std::allocator<psy::C::FieldDeclarationSymbol_const*>>
      ::emplace_back<psy::C::FieldDeclarationSymbol_const*>
                ((vector<psy::C::FieldDeclarationSymbol_const*,std::allocator<psy::C::FieldDeclarationSymbol_const*>>
                  *)decls,(FieldDeclarationSymbol **)&local_40);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/SemanticModel.cpp"
                 ,0x5c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<empty message>",0xf);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
  }
  ppFVar1 = (decls->
            super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  (local_38->
  super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  )._M_impl.super__Vector_impl_data._M_start =
       (decls->
       super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (local_38->
  super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = ppFVar1;
  (local_38->
  super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       (decls->
       super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (decls->
  super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (decls->
  super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (decls->
  super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return local_38;
}

Assistant:

VecT SemanticModel::fieldsFor_CORE(
        const FieldDeclarationSyntax* node,
        VecT&& decls)
{
    // Anonymous structure/union fields are bound to the field declaration
    // syntax node while regular fields to the declarators syntax nodes.
    auto it = P->declsBySyntax_.find(node);
    if (it != P->declsBySyntax_.end()) {
        auto decl = it->second->asDeclaration();
        PSY_ASSERT_2(decl->kind() == SymbolKind::FieldDeclaration, return decls);
        decls.push_back(decl->asFieldDeclaration());
    }
    else {
        for (auto decltorIt = node->declarators(); decltorIt; decltorIt = decltorIt->next) {
            auto decl = declarationBy(decltorIt->value);
            if (!decl) {
                PSY_ASSERT_1(!P->bindingIsOK_);
                continue;
            }
            PSY_ASSERT_2(decl->kind() == SymbolKind::FieldDeclaration, continue);
            decls.push_back(decl->asFieldDeclaration());
        }
    }
    return std::move(decls);
}